

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

Array<char> * __thiscall
kj::Vector<char>::releaseAsArray(Array<char> *__return_storage_ptr__,Vector<char> *this)

{
  char *pcVar1;
  ArrayDisposer *pAVar2;
  RemoveConst<char> *pRVar3;
  
  pRVar3 = (this->builder).pos;
  if (pRVar3 != (this->builder).endPtr) {
    setCapacity(this,(long)pRVar3 - (long)(this->builder).ptr);
    pRVar3 = (this->builder).pos;
  }
  pcVar1 = (this->builder).ptr;
  pAVar2 = (this->builder).disposer;
  __return_storage_ptr__->ptr = pcVar1;
  __return_storage_ptr__->size_ = (long)pRVar3 - (long)pcVar1;
  __return_storage_ptr__->disposer = pAVar2;
  (this->builder).ptr = (char *)0x0;
  (this->builder).pos = (RemoveConst<char> *)0x0;
  (this->builder).endPtr = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

inline Array<T> releaseAsArray() {
    // TODO(perf):  Avoid a copy/move by allowing Array<T> to point to incomplete space?
    if (!builder.isFull()) {
      setCapacity(size());
    }
    return builder.finish();
  }